

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_Configure
                  (PaAlsaStream *self,PaStreamParameters *inParams,PaStreamParameters *outParams,
                  double sampleRate,unsigned_long framesPerUserBuffer,double *inputLatency,
                  double *outputLatency,PaUtilHostBufferSizeMode *hostBufferSizeMode)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  snd_pcm_t *psVar6;
  snd_pcm_t *psVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  PaStreamParameters *pPVar13;
  PaStreamParameters *pPVar14;
  unsigned_long frames;
  size_t sVar15;
  snd_pcm_hw_params_t *psVar16;
  snd_pcm_hw_params_t *psVar17;
  PaTime *latency;
  double *pdVar18;
  double dVar19;
  int iVar20;
  size_t sVar21;
  snd_pcm_hw_params_t *psVar22;
  snd_pcm_hw_params_t asStack_d0 [8];
  snd_pcm_hw_params_t asStack_c8 [8];
  undefined8 uStack_c0;
  snd_pcm_hw_params_t asStack_b8 [8];
  unsigned_long local_b0;
  unsigned_long local_a8;
  unsigned_long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  unsigned_long local_80;
  unsigned_long minFramesPerHostBuffer;
  size_t sStack_70;
  int err;
  size_t __alsa_alloca_size_1;
  size_t __alsa_alloca_size;
  snd_pcm_hw_params_t *hwParamsPlayback;
  snd_pcm_hw_params_t *hwParamsCapture;
  double realSr;
  double *pdStack_40;
  PaError result;
  double *outputLatency_local;
  double *inputLatency_local;
  unsigned_long framesPerUserBuffer_local;
  double sampleRate_local;
  PaStreamParameters *outParams_local;
  PaStreamParameters *inParams_local;
  PaAlsaStream *self_local;
  
  realSr._4_4_ = 0;
  uStack_c0 = 0x10e3b6;
  hwParamsCapture = (snd_pcm_hw_params_t *)sampleRate;
  pdStack_40 = outputLatency;
  outputLatency_local = inputLatency;
  inputLatency_local = (double *)framesPerUserBuffer;
  framesPerUserBuffer_local = (unsigned_long)sampleRate;
  sampleRate_local = (double)outParams;
  outParams_local = inParams;
  inParams_local = (PaStreamParameters *)self;
  sVar21 = (*(code *)alsa_snd_pcm_hw_params_sizeof)();
  lVar12 = -(sVar21 + 0xf & 0xfffffffffffffff0);
  psVar22 = asStack_b8 + lVar12;
  __alsa_alloca_size_1 = sVar21;
  hwParamsPlayback = psVar22;
  *(undefined8 *)(asStack_b8 + lVar12 + -8) = 0x10e3e2;
  memset(psVar22,0,sVar21);
  *(undefined8 *)(asStack_b8 + lVar12 + -8) = 0x10e3ed;
  sVar21 = (*(code *)alsa_snd_pcm_hw_params_sizeof)();
  psVar22 = psVar22 + -(sVar21 + 0xf & 0xfffffffffffffff0);
  sStack_70 = sVar21;
  __alsa_alloca_size = (size_t)psVar22;
  *(undefined8 *)(psVar22 + -8) = 0x10e419;
  memset(psVar22,0,sVar21);
  pPVar14 = outParams_local;
  psVar16 = hwParamsPlayback;
  lVar12._0_4_ = inParams_local[0x16].device;
  lVar12._4_4_ = inParams_local[0x16].channelCount;
  if (lVar12 != 0) {
    pPVar13 = inParams_local + 0x14;
    iVar20 = inParams_local[0x11].device;
    *(undefined8 *)(psVar22 + -8) = 0x10e44f;
    paUtilErr_ = PaAlsaStreamComponent_InitialConfigure
                           ((PaAlsaStreamComponent *)&pPVar13->sampleFormat,pPVar14,iVar20,psVar16,
                            (double *)&hwParamsCapture);
    if (paUtilErr_ < 0) {
      *(undefined8 *)(psVar22 + -8) = 0x10e476;
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_InitialConfigure( &self->capture, inParams, self->primeBuffers, hwParamsCapture, &realSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2714\n"
                       );
      return paUtilErr_;
    }
  }
  dVar19 = sampleRate_local;
  sVar15 = __alsa_alloca_size;
  lVar1._0_4_ = inParams_local[0x1a].device;
  lVar1._4_4_ = inParams_local[0x1a].channelCount;
  if (lVar1 != 0) {
    pPVar14 = inParams_local + 0x18;
    iVar20 = inParams_local[0x11].device;
    *(undefined8 *)(psVar22 + -8) = 0x10e4be;
    paUtilErr_ = PaAlsaStreamComponent_InitialConfigure
                           ((PaAlsaStreamComponent *)&pPVar14->sampleFormat,
                            (PaStreamParameters *)dVar19,iVar20,(snd_pcm_hw_params_t *)sVar15,
                            (double *)&hwParamsCapture);
    if (paUtilErr_ < 0) {
      *(undefined8 *)(psVar22 + -8) = 0x10e4e5;
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_InitialConfigure( &self->playback, outParams, self->primeBuffers, hwParamsPlayback, &realSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2717\n"
                       );
      return paUtilErr_;
    }
  }
  pPVar13 = inParams_local;
  pPVar14 = outParams_local;
  dVar19 = sampleRate_local;
  pdVar18 = inputLatency_local;
  psVar17 = hwParamsCapture;
  psVar16 = hwParamsPlayback;
  sVar15 = __alsa_alloca_size;
  *(PaUtilHostBufferSizeMode **)(psVar22 + -0x10) = hostBufferSizeMode;
  *(undefined8 *)(psVar22 + -0x18) = 0x10e527;
  paUtilErr_ = PaAlsaStream_DetermineFramesPerBuffer
                         ((PaAlsaStream *)pPVar13,(double)psVar17,pPVar14,
                          (PaStreamParameters *)dVar19,(unsigned_long)pdVar18,psVar16,
                          (snd_pcm_hw_params_t *)sVar15,
                          *(PaUtilHostBufferSizeMode **)(psVar22 + -0x10));
  pPVar14 = outParams_local;
  pdVar18 = outputLatency_local;
  psVar17 = hwParamsCapture;
  psVar16 = hwParamsPlayback;
  if (paUtilErr_ < 0) {
    *(undefined8 *)(psVar22 + -8) = 0x10e552;
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_DetermineFramesPerBuffer( self, realSr, inParams, outParams, framesPerUserBuffer, hwParamsCapture, hwParamsPlayback, hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2720\n"
                     );
    realSr._4_4_ = paUtilErr_;
  }
  else {
    lVar2._0_4_ = inParams_local[0x16].device;
    lVar2._4_4_ = inParams_local[0x16].channelCount;
    if (lVar2 != 0) {
      if (inParams_local[0x16].sampleFormat == 0) {
        *(undefined8 *)(psVar22 + -8) = 0x10e5a3;
        __assert_fail("self->capture.framesPerPeriod != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xaa4,
                      "PaError PaAlsaStream_Configure(PaAlsaStream *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, double *, double *, PaUtilHostBufferSizeMode *)"
                     );
      }
      pPVar13 = inParams_local + 0x14;
      iVar20 = inParams_local[0x11].device;
      *(undefined8 *)(psVar22 + -8) = 0x10e5d0;
      paUtilErr_ = PaAlsaStreamComponent_FinishConfigure
                             ((PaAlsaStreamComponent *)&pPVar13->sampleFormat,psVar16,pPVar14,iVar20
                              ,(double)psVar17,pdVar18);
      if (paUtilErr_ < 0) {
        *(undefined8 *)(psVar22 + -8) = 0x10e5f7;
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_FinishConfigure( &self->capture, hwParamsCapture, inParams, self->primeBuffers, realSr, inputLatency )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2726\n"
                         );
        return paUtilErr_;
      }
    }
    dVar19 = sampleRate_local;
    latency = pdStack_40;
    psVar16 = hwParamsCapture;
    sVar15 = __alsa_alloca_size;
    lVar3._0_4_ = inParams_local[0x1a].device;
    lVar3._4_4_ = inParams_local[0x1a].channelCount;
    if (lVar3 != 0) {
      if (inParams_local[0x1a].sampleFormat == 0) {
        *(undefined8 *)(psVar22 + -8) = 0x10e64a;
        __assert_fail("self->playback.framesPerPeriod != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xaab,
                      "PaError PaAlsaStream_Configure(PaAlsaStream *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, double *, double *, PaUtilHostBufferSizeMode *)"
                     );
      }
      pPVar14 = inParams_local + 0x18;
      iVar20 = inParams_local[0x11].device;
      *(undefined8 *)(psVar22 + -8) = 0x10e677;
      paUtilErr_ = PaAlsaStreamComponent_FinishConfigure
                             ((PaAlsaStreamComponent *)&pPVar14->sampleFormat,
                              (snd_pcm_hw_params_t *)sVar15,(PaStreamParameters *)dVar19,iVar20,
                              (double)psVar16,latency);
      if (paUtilErr_ < 0) {
        *(undefined8 *)(psVar22 + -8) = 0x10e69e;
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_FinishConfigure( &self->playback, hwParamsPlayback, outParams, self->primeBuffers, realSr, outputLatency )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2733\n"
                         );
        return paUtilErr_;
      }
    }
    inParams_local[2].sampleFormat = (PaSampleFormat)hwParamsCapture;
    if (((inParams_local[0x11].channelCount != 0) &&
        (lVar4._0_4_ = inParams_local[0x16].device, lVar4._4_4_ = inParams_local[0x16].channelCount,
        lVar4 != 0)) &&
       (lVar5._0_4_ = inParams_local[0x1a].device, lVar5._4_4_ = inParams_local[0x1a].channelCount,
       lVar5 != 0)) {
      psVar6 = *(snd_pcm_t **)(inParams_local + 0x16);
      psVar7 = *(snd_pcm_t **)(inParams_local + 0x1a);
      *(undefined8 *)(psVar22 + -8) = 0x10e706;
      minFramesPerHostBuffer._4_4_ = (*alsa_snd_pcm_link)(psVar6,psVar7);
      if (minFramesPerHostBuffer._4_4_ == 0) {
        *(undefined4 *)&inParams_local[0x11].sampleFormat = 1;
      }
    }
    pPVar14 = inParams_local;
    lVar8._0_4_ = inParams_local[0x16].device;
    lVar8._4_4_ = inParams_local[0x16].channelCount;
    if (lVar8 == 0) {
      local_88 = 0xffffffffffffffff;
    }
    else {
      local_88 = inParams_local[0x16].sampleFormat;
    }
    local_90 = local_88;
    lVar9._0_4_ = inParams_local[0x1a].device;
    lVar9._4_4_ = inParams_local[0x1a].channelCount;
    if (lVar9 == 0) {
      local_98 = 0xffffffffffffffff;
    }
    else {
      local_98 = inParams_local[0x1a].sampleFormat;
    }
    if (local_88 < local_98) {
      lVar10._0_4_ = inParams_local[0x16].device;
      lVar10._4_4_ = inParams_local[0x16].channelCount;
      if (lVar10 == 0) {
        local_a0 = 0xffffffffffffffff;
      }
      else {
        local_a0 = inParams_local[0x16].sampleFormat;
      }
      local_a8 = local_a0;
    }
    else {
      lVar11._0_4_ = inParams_local[0x1a].device;
      lVar11._4_4_ = inParams_local[0x1a].channelCount;
      if (lVar11 == 0) {
        local_b0 = 0xffffffffffffffff;
      }
      else {
        local_b0 = inParams_local[0x1a].sampleFormat;
      }
      local_a8 = local_b0;
    }
    frames = local_a8;
    local_80 = local_a8;
    *(undefined8 *)(psVar22 + -8) = 0x10e839;
    iVar20 = CalculatePollTimeout((PaAlsaStream *)pPVar14,frames);
    *(int *)&inParams_local[0x11].hostApiSpecificStreamInfo = iVar20;
  }
  return realSr._4_4_;
}

Assistant:

static PaError PaAlsaStream_Configure( PaAlsaStream *self, const PaStreamParameters *inParams, const PaStreamParameters*
        outParams, double sampleRate, unsigned long framesPerUserBuffer, double* inputLatency, double* outputLatency,
        PaUtilHostBufferSizeMode* hostBufferSizeMode )
{
    PaError result = paNoError;
    double realSr = sampleRate;
    snd_pcm_hw_params_t* hwParamsCapture, * hwParamsPlayback;

    alsa_snd_pcm_hw_params_alloca( &hwParamsCapture );
    alsa_snd_pcm_hw_params_alloca( &hwParamsPlayback );

    if( self->capture.pcm )
        PA_ENSURE( PaAlsaStreamComponent_InitialConfigure( &self->capture, inParams, self->primeBuffers, hwParamsCapture,
                    &realSr ) );
    if( self->playback.pcm )
        PA_ENSURE( PaAlsaStreamComponent_InitialConfigure( &self->playback, outParams, self->primeBuffers, hwParamsPlayback,
                    &realSr ) );

    PA_ENSURE( PaAlsaStream_DetermineFramesPerBuffer( self, realSr, inParams, outParams, framesPerUserBuffer,
                hwParamsCapture, hwParamsPlayback, hostBufferSizeMode ) );

    if( self->capture.pcm )
    {
        assert( self->capture.framesPerPeriod != 0 );
        PA_ENSURE( PaAlsaStreamComponent_FinishConfigure( &self->capture, hwParamsCapture, inParams, self->primeBuffers, realSr,
                    inputLatency ) );
        PA_DEBUG(( "%s: Capture period size: %lu, latency: %f\n", __FUNCTION__, self->capture.framesPerPeriod, *inputLatency ));
    }
    if( self->playback.pcm )
    {
        assert( self->playback.framesPerPeriod != 0 );
        PA_ENSURE( PaAlsaStreamComponent_FinishConfigure( &self->playback, hwParamsPlayback, outParams, self->primeBuffers, realSr,
                    outputLatency ) );
        PA_DEBUG(( "%s: Playback period size: %lu, latency: %f\n", __FUNCTION__, self->playback.framesPerPeriod, *outputLatency ));
    }

    /* Should be exact now */
    self->streamRepresentation.streamInfo.sampleRate = realSr;

    /* this will cause the two streams to automatically start/stop/prepare in sync.
     * We only need to execute these operations on one of the pair.
     * A: We don't want to do this on a blocking stream.
     */
    if( self->callbackMode && self->capture.pcm && self->playback.pcm )
    {
        int err = alsa_snd_pcm_link( self->capture.pcm, self->playback.pcm );
        if( err == 0 )
            self->pcmsSynced = 1;
        else
            PA_DEBUG(( "%s: Unable to sync pcms: %s\n", __FUNCTION__, alsa_snd_strerror( err ) ));
    }

    {
        unsigned long minFramesPerHostBuffer = PA_MIN( self->capture.pcm ? self->capture.framesPerPeriod : ULONG_MAX,
            self->playback.pcm ? self->playback.framesPerPeriod : ULONG_MAX );
        self->pollTimeout = CalculatePollTimeout( self, minFramesPerHostBuffer );    /* Period in msecs, rounded up */

        /* Time before watchdog unthrottles realtime thread == 1/4 of period time in msecs */
        /* self->threading.throttledSleepTime = (unsigned long) (minFramesPerHostBuffer / sampleRate / 4 * 1000); */
    }

    if( self->callbackMode )
    {
        /* If the user expects a certain number of frames per callback we will either have to rely on block adaption
         * (framesPerHostBuffer is not an integer multiple of framesPerPeriod) or we can simply align the number
         * of host buffer frames with what the user specified */
        if( self->framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* self->alignFrames = 1; */

            /* Unless the ratio between number of host and user buffer frames is an integer we will have to rely
             * on block adaption */
        /*
            if( framesPerHostBuffer % framesPerPeriod != 0 || (self->capture.pcm && self->playback.pcm &&
                        self->capture.framesPerPeriod != self->playback.framesPerPeriod) )
                self->useBlockAdaption = 1;
            else
                self->alignFrames = 1;
        */
        }
    }

error:
    return result;
}